

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# miniaudio.h
# Opt level: O0

ma_result ma_async_notification_event_uninit(ma_async_notification_event *pNotificationEvent)

{
  ma_async_notification_event *pNotificationEvent_local;
  undefined4 local_4;
  
  if (pNotificationEvent == (ma_async_notification_event *)0x0) {
    local_4 = MA_INVALID_ARGS;
  }
  else {
    local_4 = MA_NOT_IMPLEMENTED;
  }
  return local_4;
}

Assistant:

MA_API ma_result ma_async_notification_event_uninit(ma_async_notification_event* pNotificationEvent)
{
    if (pNotificationEvent == NULL) {
        return MA_INVALID_ARGS;
    }

    #ifndef MA_NO_THREADING
    {
        ma_event_uninit(&pNotificationEvent->e);
        return MA_SUCCESS;
    }
    #else
    {
        return MA_NOT_IMPLEMENTED;  /* Threading is disabled. */
    }
    #endif
}